

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O1

void __thiscall ycqian::thread_pool::execute(thread_pool *this,function<void_()> *f)

{
  pthread_mutex_t *__mutex;
  undefined8 uVar1;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)
            (this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
              (&(((this->data_).
                  super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->tasks).c,f);
    pthread_mutex_unlock(__mutex);
    std::condition_variable::notify_one();
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar1);
}

Assistant:

void execute(std::function<void()> &&f) {
            {
                std::lock_guard<std::mutex> lg(data_->mutex);
                data_->tasks.push(f);
            }
            data_->cv.notify_one();
        }